

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void ycc_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  jpeg_color_deconverter *pjVar4;
  JSAMPLE *pJVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  ulong uVar13;
  ulong uVar14;
  JSAMPROW pJVar15;
  uint local_48;
  
  local_48 = input_row;
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        *pJVar15 = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[1] = pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                               *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                            uVar13];
        pJVar15[2] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15 = pJVar15 + 3;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        pJVar15[uVar14 * 4] = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[uVar14 * 4 + 1] =
             pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                       *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar13];
        pJVar15[uVar14 * 4 + 2] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15[uVar14 * 4 + 3] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_BGR:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf + 2;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        *pJVar15 = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[-1] = pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                                *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                             uVar13];
        pJVar15[-2] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15 = pJVar15 + 3;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        pJVar15[uVar14 * 4 + 2] = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[uVar14 * 4 + 1] =
             pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                       *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar13];
        pJVar15[uVar14 * 4] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15[uVar14 * 4 + 3] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        pJVar15[uVar14 * 4 + 3] = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[uVar14 * 4 + 2] =
             pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                       *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar13];
        pJVar15[uVar14 * 4 + 1] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15[uVar14 * 4] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        pJVar15[uVar14 * 4 + 1] = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[uVar14 * 4 + 2] =
             pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                       *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar13];
        pJVar15[uVar14 * 4 + 3] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15[uVar14 * 4] = 0xff;
      }
      output_buf = output_buf + 1;
    }
    break;
  default:
    pjVar4 = cinfo->cconvert;
    uVar3 = cinfo->output_width;
    pJVar5 = cinfo->sample_range_limit;
    p_Var6 = pjVar4[1].start_pass;
    p_Var7 = pjVar4[1].color_convert;
    p_Var8 = pjVar4[2].start_pass;
    p_Var9 = pjVar4[2].color_convert;
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      uVar14 = (ulong)local_48;
      pJVar10 = (*input_buf)[uVar14];
      pJVar11 = input_buf[1][uVar14];
      pJVar12 = input_buf[2][uVar14];
      local_48 = local_48 + 1;
      pJVar15 = *output_buf;
      for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
        uVar13 = (ulong)pJVar10[uVar14];
        bVar1 = pJVar11[uVar14];
        bVar2 = pJVar12[uVar14];
        *pJVar15 = pJVar5[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar13];
        pJVar15[1] = pJVar5[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                               *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                            uVar13];
        pJVar15[2] = pJVar5[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar13];
        pJVar15 = pJVar15 + 3;
      }
      output_buf = output_buf + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    ycc_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    ycc_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    ycc_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    ycc_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    ycc_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    ycc_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  default:
    ycc_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                             num_rows);
    break;
  }
}